

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O0

void snapshot_with_uncomitted_data_test(void)

{
  fdb_status s;
  fdb_seqnum_t seqnum;
  fdb_kvs_info info;
  fdb_kvs_config kvs_config;
  fdb_config config;
  fdb_kvs_handle *snap;
  fdb_kvs_handle *db2;
  fdb_kvs_handle *db1;
  fdb_kvs_handle *db0;
  fdb_file_handle *db_file;
  char valuestr [8];
  char keystr [8];
  char *value;
  char key [256];
  char cmd [256];
  int idx;
  int r;
  int i;
  int value_len;
  int n;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_kvs_handle *in_stack_fffffffffffffaa8;
  fdb_kvs_handle *in_stack_fffffffffffffac8;
  char *in_stack_fffffffffffffad0;
  size_t in_stack_fffffffffffffad8;
  char *in_stack_fffffffffffffae0;
  fdb_kvs_handle *in_stack_fffffffffffffae8;
  fdb_kvs_config *local_500;
  char *local_4f8;
  undefined1 local_4f0 [252];
  fdb_status local_3f4;
  fdb_kvs_info *in_stack_fffffffffffffc10;
  fdb_kvs_info *info_00;
  fdb_kvs_handle *in_stack_fffffffffffffc18;
  fdb_kvs_info *local_3e0;
  fdb_kvs_handle **in_stack_fffffffffffffc60;
  fdb_file_handle *fhandle;
  fdb_config *in_stack_fffffffffffffcc8;
  char *in_stack_fffffffffffffcd0;
  fdb_file_handle **in_stack_fffffffffffffcd8;
  fdb_seqnum_t in_stack_fffffffffffffd50;
  fdb_kvs_handle **in_stack_fffffffffffffd58;
  fdb_kvs_handle *in_stack_fffffffffffffd60;
  size_t local_298;
  fdb_kvs_handle *local_290;
  char local_280 [8];
  char local_278 [8];
  char *local_270;
  char local_268 [256];
  char local_168 [260];
  uint local_64;
  int local_60;
  uint local_5c;
  int local_58;
  int local_54;
  __time_t local_30;
  __suseconds_t local_28;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  local_30 = local_10.tv_sec;
  local_28 = local_10.tv_usec;
  local_54 = 10;
  local_58 = 0x20;
  builtin_strncpy(local_278,"key%06d",8);
  builtin_strncpy(local_280,"value%d",8);
  sprintf(local_168,"rm -rf  mvcc_test* > errorlog.txt");
  local_60 = system(local_168);
  memleak_start();
  local_270 = (char *)malloc((long)local_58);
  srand(0x4d2);
  fdb_get_default_config();
  memcpy(&stack0xfffffffffffffc60,local_4f0,0xf8);
  fhandle = (fdb_file_handle *)0x0;
  fdb_get_default_kvs_config();
  local_3f4 = fdb_open(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8
                      );
  if (local_3f4 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x30e);
    snapshot_with_uncomitted_data_test::__test_pass = 0;
    if (local_3f4 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x30e,"void snapshot_with_uncomitted_data_test()");
    }
  }
  local_3f4 = fdb_kvs_open(fhandle,in_stack_fffffffffffffc60,local_4f8,local_500);
  if (local_3f4 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x310);
    snapshot_with_uncomitted_data_test::__test_pass = 0;
    if (local_3f4 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x310,"void snapshot_with_uncomitted_data_test()");
    }
  }
  local_3f4 = fdb_kvs_open(fhandle,in_stack_fffffffffffffc60,local_4f8,local_500);
  if (local_3f4 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x312);
    snapshot_with_uncomitted_data_test::__test_pass = 0;
    if (local_3f4 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x312,"void snapshot_with_uncomitted_data_test()");
    }
  }
  local_3f4 = fdb_kvs_open(fhandle,in_stack_fffffffffffffc60,local_4f8,local_500);
  if (local_3f4 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x314);
    snapshot_with_uncomitted_data_test::__test_pass = 0;
    if (local_3f4 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x314,"void snapshot_with_uncomitted_data_test()");
    }
  }
  local_5c = 0;
  do {
    if (local_54 <= (int)local_5c) {
      local_3f4 = fdb_get_kvs_info(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
      if (local_3f4 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x326);
        snapshot_with_uncomitted_data_test::__test_pass = 0;
        if (local_3f4 != FDB_RESULT_SUCCESS) {
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x326,"void snapshot_with_uncomitted_data_test()");
        }
      }
      local_3f4 = fdb_snapshot_open(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                                    in_stack_fffffffffffffd50);
      if (local_3f4 == FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x328);
        snapshot_with_uncomitted_data_test::__test_pass = 0;
        if (local_3f4 == FDB_RESULT_SUCCESS) {
          __assert_fail("s != FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x328,"void snapshot_with_uncomitted_data_test()");
        }
      }
      local_3f4 = fdb_get_kvs_info(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
      if (local_3f4 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x32b);
        snapshot_with_uncomitted_data_test::__test_pass = 0;
        if (local_3f4 != FDB_RESULT_SUCCESS) {
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x32b,"void snapshot_with_uncomitted_data_test()");
        }
      }
      local_3f4 = fdb_snapshot_open(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                                    in_stack_fffffffffffffd50);
      if (local_3f4 == FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x32d);
        snapshot_with_uncomitted_data_test::__test_pass = 0;
        if (local_3f4 == FDB_RESULT_SUCCESS) {
          __assert_fail("s != FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x32d,"void snapshot_with_uncomitted_data_test()");
        }
      }
      local_3f4 = fdb_get_kvs_info(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
      if (local_3f4 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x330);
        snapshot_with_uncomitted_data_test::__test_pass = 0;
        if (local_3f4 != FDB_RESULT_SUCCESS) {
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x330,"void snapshot_with_uncomitted_data_test()");
        }
      }
      local_3f4 = fdb_snapshot_open(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                                    in_stack_fffffffffffffd50);
      if (local_3f4 == FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x332);
        snapshot_with_uncomitted_data_test::__test_pass = 0;
        if (local_3f4 == FDB_RESULT_SUCCESS) {
          __assert_fail("s != FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x332,"void snapshot_with_uncomitted_data_test()");
        }
      }
      local_3f4 = fdb_commit((fdb_file_handle *)in_stack_fffffffffffffaa8,'\0');
      if (local_3f4 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x335);
        snapshot_with_uncomitted_data_test::__test_pass = 0;
        if (local_3f4 != FDB_RESULT_SUCCESS) {
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x335,"void snapshot_with_uncomitted_data_test()");
        }
      }
      local_3f4 = fdb_get_kvs_info(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
      if (local_3f4 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x338);
        snapshot_with_uncomitted_data_test::__test_pass = 0;
        if (local_3f4 != FDB_RESULT_SUCCESS) {
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x338,"void snapshot_with_uncomitted_data_test()");
        }
      }
      info_00 = local_3e0;
      local_3f4 = fdb_get_kvs_info(in_stack_fffffffffffffc18,local_3e0);
      if (local_3f4 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x33c);
        snapshot_with_uncomitted_data_test::__test_pass = 0;
        if (local_3f4 != FDB_RESULT_SUCCESS) {
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x33c,"void snapshot_with_uncomitted_data_test()");
        }
      }
      if (info_00 != local_3e0) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x33d);
        snapshot_with_uncomitted_data_test::__test_pass = 0;
        if (info_00 != local_3e0) {
          __assert_fail("seqnum == info.last_seqnum",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x33d,"void snapshot_with_uncomitted_data_test()");
        }
      }
      local_3f4 = fdb_get_kvs_info(in_stack_fffffffffffffc18,info_00);
      if (local_3f4 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x340);
        snapshot_with_uncomitted_data_test::__test_pass = 0;
        if (local_3f4 != FDB_RESULT_SUCCESS) {
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x340,"void snapshot_with_uncomitted_data_test()");
        }
      }
      if (info_00 != local_3e0) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x341);
        snapshot_with_uncomitted_data_test::__test_pass = 0;
        if (info_00 != local_3e0) {
          __assert_fail("seqnum == info.last_seqnum",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x341,"void snapshot_with_uncomitted_data_test()");
        }
      }
      local_5c = 0;
      do {
        if (local_54 <= (int)local_5c) {
          local_3f4 = fdb_get_kvs_info(in_stack_fffffffffffffc18,info_00);
          if (local_3f4 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x352);
            snapshot_with_uncomitted_data_test::__test_pass = 0;
            if (local_3f4 != FDB_RESULT_SUCCESS) {
              __assert_fail("s == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                            ,0x352,"void snapshot_with_uncomitted_data_test()");
            }
          }
          local_3f4 = fdb_snapshot_open(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                                        in_stack_fffffffffffffd50);
          if (local_3f4 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x355);
            snapshot_with_uncomitted_data_test::__test_pass = 0;
            if (local_3f4 != FDB_RESULT_SUCCESS) {
              __assert_fail("s == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                            ,0x355,"void snapshot_with_uncomitted_data_test()");
            }
          }
          local_3f4 = fdb_kvs_close(in_stack_fffffffffffffaa8);
          if (local_3f4 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x357);
            snapshot_with_uncomitted_data_test::__test_pass = 0;
            if (local_3f4 != FDB_RESULT_SUCCESS) {
              __assert_fail("s == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                            ,0x357,"void snapshot_with_uncomitted_data_test()");
            }
          }
          local_3f4 = fdb_get_kvs_info(in_stack_fffffffffffffc18,info_00);
          if (local_3f4 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x35b);
            snapshot_with_uncomitted_data_test::__test_pass = 0;
            if (local_3f4 != FDB_RESULT_SUCCESS) {
              __assert_fail("s == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                            ,0x35b,"void snapshot_with_uncomitted_data_test()");
            }
          }
          local_3f4 = fdb_snapshot_open(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                                        in_stack_fffffffffffffd50);
          if (local_3f4 == FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x35f);
            snapshot_with_uncomitted_data_test::__test_pass = 0;
            if (local_3f4 == FDB_RESULT_SUCCESS) {
              __assert_fail("s != FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                            ,0x35f,"void snapshot_with_uncomitted_data_test()");
            }
          }
          local_3f4 = fdb_snapshot_open(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                                        in_stack_fffffffffffffd50);
          if (local_3f4 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x362);
            snapshot_with_uncomitted_data_test::__test_pass = 0;
            if (local_3f4 != FDB_RESULT_SUCCESS) {
              __assert_fail("s == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                            ,0x362,"void snapshot_with_uncomitted_data_test()");
            }
          }
          local_3f4 = fdb_kvs_close(in_stack_fffffffffffffaa8);
          if (local_3f4 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x364);
            snapshot_with_uncomitted_data_test::__test_pass = 0;
            if (local_3f4 != FDB_RESULT_SUCCESS) {
              __assert_fail("s == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                            ,0x364,"void snapshot_with_uncomitted_data_test()");
            }
          }
          local_3f4 = fdb_get_kvs_info(in_stack_fffffffffffffc18,info_00);
          if (local_3f4 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x368);
            snapshot_with_uncomitted_data_test::__test_pass = 0;
            if (local_3f4 != FDB_RESULT_SUCCESS) {
              __assert_fail("s == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                            ,0x368,"void snapshot_with_uncomitted_data_test()");
            }
          }
          local_3f4 = fdb_snapshot_open(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                                        in_stack_fffffffffffffd50);
          if (local_3f4 == FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x36c);
            snapshot_with_uncomitted_data_test::__test_pass = 0;
            if (local_3f4 == FDB_RESULT_SUCCESS) {
              __assert_fail("s != FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                            ,0x36c,"void snapshot_with_uncomitted_data_test()");
            }
          }
          local_3f4 = fdb_snapshot_open(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                                        in_stack_fffffffffffffd50);
          if (local_3f4 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x36f);
            snapshot_with_uncomitted_data_test::__test_pass = 0;
            if (local_3f4 != FDB_RESULT_SUCCESS) {
              __assert_fail("s == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                            ,0x36f,"void snapshot_with_uncomitted_data_test()");
            }
          }
          local_3f4 = fdb_kvs_close(in_stack_fffffffffffffaa8);
          if (local_3f4 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x371);
            snapshot_with_uncomitted_data_test::__test_pass = 0;
            if (local_3f4 != FDB_RESULT_SUCCESS) {
              __assert_fail("s == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                            ,0x371,"void snapshot_with_uncomitted_data_test()");
            }
          }
          local_3f4 = fdb_close((fdb_file_handle *)in_stack_fffffffffffffaa8);
          if (local_3f4 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x374);
            snapshot_with_uncomitted_data_test::__test_pass = 0;
            if (local_3f4 != FDB_RESULT_SUCCESS) {
              __assert_fail("s == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                            ,0x374,"void snapshot_with_uncomitted_data_test()");
            }
          }
          local_3f4 = fdb_shutdown();
          if (local_3f4 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x376);
            snapshot_with_uncomitted_data_test::__test_pass = 0;
            if (local_3f4 != FDB_RESULT_SUCCESS) {
              __assert_fail("s == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                            ,0x376,"void snapshot_with_uncomitted_data_test()");
            }
          }
          free(local_270);
          memleak_end();
          if (snapshot_with_uncomitted_data_test::__test_pass == 0) {
            fprintf(_stderr,"%s FAILED\n","snapshot with uncomitted data in other KVS test");
          }
          else {
            fprintf(_stderr,"%s PASSED\n","snapshot with uncomitted data in other KVS test");
          }
          return;
        }
        local_64 = local_5c;
        sprintf(local_268,local_278,(ulong)local_5c);
        memset(local_270,0x78,(long)local_58);
        builtin_strncpy(local_270 + (long)local_58 + -6,"<end>",6);
        sprintf(local_270,local_280,(ulong)local_64);
        strlen(local_268);
        local_3f4 = fdb_set_kv(in_stack_fffffffffffffae8,in_stack_fffffffffffffae0,
                               in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,
                               (size_t)in_stack_fffffffffffffac8);
        in_stack_fffffffffffffaa8 = in_stack_fffffffffffffd60;
        if (local_3f4 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x34b);
          snapshot_with_uncomitted_data_test::__test_pass = 0;
          in_stack_fffffffffffffaa8 = in_stack_fffffffffffffd60;
          if (local_3f4 != FDB_RESULT_SUCCESS) {
            __assert_fail("s == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0x34b,"void snapshot_with_uncomitted_data_test()");
          }
        }
        in_stack_fffffffffffffd60 = in_stack_fffffffffffffaa8;
        strlen(local_268);
        local_3f4 = fdb_set_kv(in_stack_fffffffffffffae8,in_stack_fffffffffffffae0,
                               in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,
                               (size_t)in_stack_fffffffffffffac8);
        if (local_3f4 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x34d);
          snapshot_with_uncomitted_data_test::__test_pass = 0;
          if (local_3f4 != FDB_RESULT_SUCCESS) {
            __assert_fail("s == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0x34d,"void snapshot_with_uncomitted_data_test()");
          }
        }
        local_5c = local_5c + 1;
      } while( true );
    }
    local_64 = local_5c;
    sprintf(local_268,local_278,(ulong)local_5c);
    memset(local_270,0x78,(long)local_58);
    builtin_strncpy(local_270 + (long)local_58 + -6,"<end>",6);
    sprintf(local_270,local_280,(ulong)local_64);
    in_stack_fffffffffffffae8 = local_290;
    strlen(local_268);
    local_3f4 = fdb_set_kv(in_stack_fffffffffffffae8,in_stack_fffffffffffffae0,
                           in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,
                           (size_t)in_stack_fffffffffffffac8);
    if (local_3f4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x31e);
      snapshot_with_uncomitted_data_test::__test_pass = 0;
      if (local_3f4 != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x31e,"void snapshot_with_uncomitted_data_test()");
      }
    }
    in_stack_fffffffffffffae0 = local_268;
    in_stack_fffffffffffffad8 = local_298;
    strlen(local_268);
    local_3f4 = fdb_set_kv(in_stack_fffffffffffffae8,in_stack_fffffffffffffae0,
                           in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,
                           (size_t)in_stack_fffffffffffffac8);
    in_stack_fffffffffffffac8 = in_stack_fffffffffffffd60;
    if (local_3f4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,800);
      snapshot_with_uncomitted_data_test::__test_pass = 0;
      in_stack_fffffffffffffac8 = in_stack_fffffffffffffd60;
      if (local_3f4 != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,800,"void snapshot_with_uncomitted_data_test()");
      }
    }
    in_stack_fffffffffffffad0 = local_268;
    in_stack_fffffffffffffd60 = in_stack_fffffffffffffac8;
    strlen(local_268);
    local_3f4 = fdb_set_kv(in_stack_fffffffffffffae8,in_stack_fffffffffffffae0,
                           in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,
                           (size_t)in_stack_fffffffffffffac8);
    if (local_3f4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x322);
      snapshot_with_uncomitted_data_test::__test_pass = 0;
      if (local_3f4 != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x322,"void snapshot_with_uncomitted_data_test()");
      }
    }
    local_5c = local_5c + 1;
  } while( true );
}

Assistant:

void snapshot_with_uncomitted_data_test()
{
    TEST_INIT();

    int n = 10, value_len=32;
    int i, r, idx;
    char cmd[256];
    char key[256], *value;
    char keystr[] = "key%06d";
    char valuestr[] = "value%d";
    fdb_file_handle *db_file;
    fdb_kvs_handle *db0, *db1, *db2, *snap;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_kvs_info info;
    fdb_seqnum_t seqnum;
    fdb_status s; (void)s;

    sprintf(cmd, SHELL_DEL " mvcc_test* > errorlog.txt");
    r = system(cmd);
    (void)r;

    memleak_start();

    value = (char*)malloc(value_len);

    srand(1234);
    config = fdb_get_default_config();
    config.seqtree_opt = FDB_SEQTREE_USE;
    config.wal_flush_before_commit = true;
    config.multi_kv_instances = true;
    config.buffercache_size = 0*1024*1024;

    kvs_config = fdb_get_default_kvs_config();

    s = fdb_open(&db_file, "./mvcc_test9", &config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_open(db_file, &db0, NULL, &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_open(db_file, &db1, "db1", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_open(db_file, &db2, "db2", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // insert docs in all KV stores
    for (i=0;i<n;++i){
        idx = i;
        sprintf(key, keystr, idx);
        memset(value, 'x', value_len);
        memcpy(value + value_len - 6, "<end>", 6);
        sprintf(value, valuestr, idx);
        s = fdb_set_kv(db0, key, strlen(key)+1, value, value_len);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        s = fdb_set_kv(db1, key, strlen(key)+1, value, value_len);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        s = fdb_set_kv(db2, key, strlen(key)+1, value, value_len);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }
    // try to open snapshot before commit
    s = fdb_get_kvs_info(db0, &info);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_snapshot_open(db0, &snap, info.last_seqnum);
    TEST_CHK(s != FDB_RESULT_SUCCESS);

    s = fdb_get_kvs_info(db1, &info);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_snapshot_open(db1, &snap, info.last_seqnum);
    TEST_CHK(s != FDB_RESULT_SUCCESS);

    s = fdb_get_kvs_info(db2, &info);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_snapshot_open(db2, &snap, info.last_seqnum);
    TEST_CHK(s != FDB_RESULT_SUCCESS);

    s = fdb_commit(db_file, FDB_COMMIT_NORMAL);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_get_kvs_info(db1, &info);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    seqnum = info.last_seqnum;

    s = fdb_get_kvs_info(db2, &info);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    TEST_CHK(seqnum == info.last_seqnum);

    s = fdb_get_kvs_info(db0, &info);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    TEST_CHK(seqnum == info.last_seqnum);

    // now insert docs into default and db2 only, without commit
    for (i=0;i<n;++i){
        idx = i;
        sprintf(key, keystr, idx);
        memset(value, 'x', value_len);
        memcpy(value + value_len - 6, "<end>", 6);
        sprintf(value, valuestr, idx);
        s = fdb_set_kv(db0, key, strlen(key)+1, value, value_len);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        s = fdb_set_kv(db2, key, strlen(key)+1, value, value_len);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }

    // open snapshot on db1
    s = fdb_get_kvs_info(db1, &info);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    // latest (comitted) seqnum
    s = fdb_snapshot_open(db1, &snap, info.last_seqnum);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_close(snap);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // open snapshot on db2
    s = fdb_get_kvs_info(db2, &info);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // latest (uncomitted) seqnum
    s = fdb_snapshot_open(db2, &snap, info.last_seqnum);
    TEST_CHK(s != FDB_RESULT_SUCCESS);
    // committed seqnum
    s = fdb_snapshot_open(db2, &snap, seqnum);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_close(snap);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // open snapshot on default KVS
    s = fdb_get_kvs_info(db0, &info);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // latest (uncomitted) seqnum
    s = fdb_snapshot_open(db0, &snap, info.last_seqnum);
    TEST_CHK(s != FDB_RESULT_SUCCESS);
    // committed seqnum
    s = fdb_snapshot_open(db0, &snap, seqnum);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_close(snap);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_close(db_file);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_shutdown();
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    free(value);
    memleak_end();

    TEST_RESULT("snapshot with uncomitted data in other KVS test");
}